

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  unsigned_short *puVar1;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  CertCompressionAlg *pCVar8;
  ulong uVar9;
  size_t i;
  ulong i_00;
  Vector<bssl::CertCompressionAlg> *this;
  ulong new_size;
  uint16_t alg_id;
  ulong local_60;
  Array<unsigned_short> given_alg_ids;
  CBS alg_ids;
  
  if (contents == (CBS *)0x0) {
    bVar5 = true;
  }
  else {
    _Var2._M_head_impl =
         (hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    uVar3 = *(size_t *)((long)&(_Var2._M_head_impl)->cert_compression_algs + 8);
    iVar7 = CBS_get_u8_length_prefixed(contents,&alg_ids);
    if (((iVar7 == 0) || (contents->len != 0)) || ((alg_ids.len & 1) != 0 || alg_ids.len == 0)) {
      bVar5 = false;
    }
    else {
      new_size = alg_ids.len >> 1;
      given_alg_ids.data_ = (unsigned_short *)0x0;
      given_alg_ids.size_ = 0;
      bVar5 = Array<unsigned_short>::InitUninitialized(&given_alg_ids,new_size);
      if (bVar5) {
        this = &(_Var2._M_head_impl)->cert_compression_algs;
        uVar9 = 0;
        local_60 = uVar3;
LAB_0013a817:
        if (alg_ids.len != 0) {
          iVar7 = CBS_get_u16(&alg_ids,&alg_id);
          if (iVar7 == 0) goto LAB_0013a8f6;
          if (given_alg_ids.size_ <= uVar9) goto LAB_0013a93d;
          given_alg_ids.data_[uVar9] = alg_id;
          uVar9 = uVar9 + 1;
          for (i_00 = 0; uVar3 != i_00; i_00 = i_00 + 1) {
            pCVar8 = Vector<bssl::CertCompressionAlg>::operator[](this,i_00);
            if ((pCVar8->alg_id == alg_id) && (pCVar8->compress != (ssl_cert_compression_func_t)0x0)
               ) {
              if (i_00 < local_60) {
                local_60 = i_00;
              }
              break;
            }
          }
          goto LAB_0013a817;
        }
        std::__sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
                  (given_alg_ids.data_,given_alg_ids.data_ + given_alg_ids.size_);
        uVar9 = 1;
        do {
          if (new_size == uVar9) {
            bVar5 = true;
            if ((local_60 < uVar3) && (uVar6 = ssl_protocol_version(hs->ssl), 0x303 < uVar6)) {
              hs->field_0x6ca = hs->field_0x6ca | 0x20;
              pCVar8 = Vector<bssl::CertCompressionAlg>::operator[](this,local_60);
              hs->cert_compression_alg_id = pCVar8->alg_id;
            }
            goto LAB_0013a8f8;
          }
          if ((uVar9 - given_alg_ids.size_ == 1) || (given_alg_ids.size_ <= uVar9)) {
LAB_0013a93d:
            abort();
          }
          lVar4 = uVar9 - 1;
          puVar1 = given_alg_ids.data_ + uVar9;
          uVar9 = uVar9 + 1;
        } while (given_alg_ids.data_[lVar4] != *puVar1);
      }
LAB_0013a8f6:
      bVar5 = false;
LAB_0013a8f8:
      Array<unsigned_short>::~Array(&given_alg_ids);
    }
  }
  return bVar5;
}

Assistant:

static bool cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,
                                               uint8_t *out_alert,
                                               CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  const SSL_CTX *ctx = hs->ssl->ctx.get();
  const size_t num_algs = ctx->cert_compression_algs.size();

  CBS alg_ids;
  if (!CBS_get_u8_length_prefixed(contents, &alg_ids) ||  //
      CBS_len(contents) != 0 ||                           //
      CBS_len(&alg_ids) == 0 ||                           //
      CBS_len(&alg_ids) % 2 == 1) {
    return false;
  }

  const size_t num_given_alg_ids = CBS_len(&alg_ids) / 2;
  Array<uint16_t> given_alg_ids;
  if (!given_alg_ids.InitForOverwrite(num_given_alg_ids)) {
    return false;
  }

  size_t best_index = num_algs;
  size_t given_alg_idx = 0;

  while (CBS_len(&alg_ids) > 0) {
    uint16_t alg_id;
    if (!CBS_get_u16(&alg_ids, &alg_id)) {
      return false;
    }

    given_alg_ids[given_alg_idx++] = alg_id;

    for (size_t i = 0; i < num_algs; i++) {
      const auto &alg = ctx->cert_compression_algs[i];
      if (alg.alg_id == alg_id && alg.compress != nullptr) {
        if (i < best_index) {
          best_index = i;
        }
        break;
      }
    }
  }

  std::sort(given_alg_ids.begin(), given_alg_ids.end());
  for (size_t i = 1; i < num_given_alg_ids; i++) {
    if (given_alg_ids[i - 1] == given_alg_ids[i]) {
      return false;
    }
  }

  if (best_index < num_algs &&
      ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    hs->cert_compression_negotiated = true;
    hs->cert_compression_alg_id = ctx->cert_compression_algs[best_index].alg_id;
  }

  return true;
}